

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  undefined8 uVar2;
  Display *pDVar3;
  unsigned_long uVar4;
  Atom AVar5;
  Atom AVar6;
  ulong uVar7;
  Window WVar8;
  undefined8 uStackY_150;
  Atom *__s;
  size_t sVar9;
  Atom targets [4];
  undefined4 local_f0 [6];
  Display *local_d8;
  int local_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  Time local_c0;
  Atom local_b8;
  Window local_b0;
  
  AVar6 = 0;
  uVar7 = 0;
  memset(local_f0,0,0xc0);
  AVar5 = _glfw.x11.UTF8_STRING;
  pDVar3 = _glfw.x11.display;
  local_f0[0] = 0x1f;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_0011c22b;
  AVar6 = (event->xselectionrequest).target;
  if (AVar6 == _glfw.x11.TARGETS) {
    __s = targets;
    targets[1] = _glfw.x11.MULTIPLE;
    targets[2] = _glfw.x11.UTF8_STRING;
    targets[3] = 0x1f;
    WVar8 = (event->xkey).root;
    uStackY_150 = 0x20;
    sVar9 = 4;
    AVar5 = 4;
    targets[0] = AVar6;
LAB_0011c129:
    XChangeProperty(pDVar3,WVar8,AVar1,AVar5,uStackY_150,0,__s,sVar9);
  }
  else {
    __s = *(Atom **)((long)_glfw.x11.keynames +
                    (ulong)((event->xkey).subwindow != _glfw.x11.PRIMARY) * 8 + -0x10);
    if (AVar6 != _glfw.x11.MULTIPLE) {
      if (AVar6 == _glfw.x11.SAVE_TARGETS) {
        WVar8 = (event->xkey).root;
        sVar9 = uVar7 & 0xffffffff00000000;
        __s = (Atom *)0x0;
        uStackY_150 = 0x20;
        AVar5 = _glfw.x11.NULL_;
      }
      else {
        if (AVar6 != 0x1f && AVar6 != _glfw.x11.UTF8_STRING) {
          AVar6 = 0;
          goto LAB_0011c22b;
        }
        WVar8 = (event->xkey).root;
        sVar9 = strlen((char *)__s);
        uStackY_150 = 8;
        AVar5 = AVar6;
      }
      goto LAB_0011c129;
    }
    uVar4 = _glfwGetWindowPropertyX11
                      ((event->xkey).root,AVar1,_glfw.x11.ATOM_PAIR,(uchar **)targets);
    for (uVar7 = 0; pDVar3 = _glfw.x11.display, uVar7 < uVar4; uVar7 = uVar7 + 2) {
      AVar1 = *(Atom *)(targets[0] + uVar7 * 8);
      if (AVar1 == AVar5 || AVar1 == 0x1f) {
        WVar8 = (event->xkey).root;
        uVar2 = *(undefined8 *)(targets[0] + 8 + uVar7 * 8);
        sVar9 = strlen((char *)__s);
        XChangeProperty(pDVar3,WVar8,uVar2,AVar1,8,0,__s,sVar9);
      }
      else {
        *(undefined8 *)(targets[0] + 8 + uVar7 * 8) = 0;
      }
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0);
    XFree(targets[0]);
  }
  AVar6 = (event->xselectionrequest).property;
LAB_0011c22b:
  local_d8 = (event->xany).display;
  local_d0 = (event->xfocus).mode;
  iStack_cc = (event->xfocus).detail;
  iStack_c8 = (event->xexpose).width;
  iStack_c4 = (event->xexpose).height;
  local_c0 = (event->xkey).time;
  local_b0 = (event->xconfigure).above;
  local_b8 = AVar6;
  XSendEvent(_glfw.x11.display,(event->xkey).root,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply = { SelectionNotify };
    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}